

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.cpp
# Opt level: O0

bool Diligent::VerifyResolveTextureSubresourceAttribs
               (ResolveTextureSubresourceAttribs *ResolveAttribs,TextureDesc *SrcTexDesc,
               TextureDesc *DstTexDesc)

{
  Char *pCVar1;
  TextureFormatAttribs *Args_1;
  TextureFormatAttribs *Args_3;
  TextureFormatAttribs *pTVar2;
  char (*in_RCX) [102];
  char (*in_R9) [47];
  TextureDesc *in_stack_fffffffffffffdb0;
  char (*in_stack_fffffffffffffe30) [3];
  undefined1 local_190 [8];
  string msg_6;
  string msg_5;
  string msg_4;
  string msg_3;
  TextureFormatAttribs *ResolveFmtAttribs;
  TextureFormatAttribs *DstFmtAttribs;
  TextureFormatAttribs *SrcFmtAttribs;
  string msg_2;
  MipLevelProperties DstMipLevelProps;
  MipLevelProperties SrcMipLevelProps;
  string msg_1;
  undefined1 local_48 [8];
  string msg;
  TextureDesc *DstTexDesc_local;
  TextureDesc *SrcTexDesc_local;
  ResolveTextureSubresourceAttribs *ResolveAttribs_local;
  
  msg.field_2._8_8_ = DstTexDesc;
  if (SrcTexDesc->SampleCount < 2) {
    FormatString<char[50],char[17],char_const*,char[47]>
              ((string *)local_48,(Diligent *)"Resolve texture subresource attribs are invalid: ",
               (char (*) [50])"source texture \'",(char (*) [17])SrcTexDesc,
               (char **)"\' of a resolve operation is not multi-sampled.",in_R9);
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    in_RCX = (char (*) [102])0x11b;
    DebugAssertionFailed
              (pCVar1,"VerifyResolveTextureSubresourceAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x11b);
    std::__cxx11::string::~string((string *)local_48);
  }
  if (*(int *)(msg.field_2._8_8_ + 0x20) != 1) {
    FormatString<char[50],char[22],char_const*,char[43]>
              ((string *)&SrcMipLevelProps.MipSize,
               (Diligent *)"Resolve texture subresource attribs are invalid: ",
               (char (*) [50])"destination texture \'",(char (*) [22])msg.field_2._8_8_,
               (char **)"\' of a resolve operation is multi-sampled.",(char (*) [43])in_R9);
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    in_RCX = (char (*) [102])0x11c;
    DebugAssertionFailed
              (pCVar1,"VerifyResolveTextureSubresourceAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x11c);
    std::__cxx11::string::~string((string *)&SrcMipLevelProps.MipSize);
  }
  GetMipLevelProperties
            ((MipLevelProperties *)&DstMipLevelProps.MipSize,SrcTexDesc,ResolveAttribs->SrcMipLevel)
  ;
  GetMipLevelProperties
            ((MipLevelProperties *)((long)&msg_2.field_2 + 8),(TextureDesc *)msg.field_2._8_8_,
             ResolveAttribs->DstMipLevel);
  if (((int)DstMipLevelProps.MipSize != msg_2.field_2._8_4_) ||
     (DstMipLevelProps.MipSize._4_4_ != msg_2.field_2._12_4_)) {
    in_stack_fffffffffffffdb0 = SrcTexDesc;
    FormatString<char[50],char[11],unsigned_int,char[2],unsigned_int,char[62],char_const*,char[8],unsigned_int,char[9],unsigned_int,char[28],unsigned_int,char[2],unsigned_int,char[44],char_const*,char[8],unsigned_int,char[9],unsigned_int,char[3]>
              ((string *)&SrcFmtAttribs,
               (Diligent *)"Resolve texture subresource attribs are invalid: ",
               (char (*) [50])0x4862b6,(char (*) [11])&DstMipLevelProps.MipSize,(uint *)0x486a3f,
               (char (*) [2])((long)&DstMipLevelProps.MipSize + 4),
               (uint *)") of the source subresource of a resolve operation (texture \'",
               (char (*) [62])SrcTexDesc,(char **)"\', mip ",(char (*) [8])ResolveAttribs,
               (uint *)", slice ",(char (*) [9])&ResolveAttribs->SrcSlice,
               (uint *)") does not match the size (",(char (*) [28])((long)&msg_2.field_2 + 8),
               (uint *)0x486a3f,(char (*) [2])((long)&msg_2.field_2 + 0xc),
               (uint *)") of the destination subresource (texture \'",
               (char (*) [44])msg.field_2._8_8_,(char **)"\', mip ",
               (char (*) [8])&ResolveAttribs->DstMipLevel,(uint *)", slice ",
               (char (*) [9])&ResolveAttribs->DstSlice,(uint *)0x490759,in_stack_fffffffffffffe30);
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    in_RCX = (char (*) [102])0x126;
    DebugAssertionFailed
              (pCVar1,"VerifyResolveTextureSubresourceAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x126);
    std::__cxx11::string::~string((string *)&SrcFmtAttribs);
  }
  Args_1 = GetTextureFormatAttribs(SrcTexDesc->Format);
  Args_3 = GetTextureFormatAttribs(*(TEXTURE_FORMAT *)(msg.field_2._8_8_ + 0x18));
  pTVar2 = GetTextureFormatAttribs(ResolveAttribs->Format);
  if (((Args_1->IsTypeless & 1U) == 0) && ((Args_3->IsTypeless & 1U) == 0)) {
    in_RCX = (char (*) [102])(ulong)*(TEXTURE_FORMAT *)(msg.field_2._8_8_ + 0x18);
    if (SrcTexDesc->Format != *(TEXTURE_FORMAT *)(msg.field_2._8_8_ + 0x18)) {
      FormatString<char[50],char[9],char_const*,char[20],char_const*,char[95]>
                ((string *)((long)&msg_4.field_2 + 8),
                 (Diligent *)"Resolve texture subresource attribs are invalid: ",
                 (char (*) [50])"source (",(char (*) [9])Args_1,(char **)") and destination (",
                 (char (*) [20])Args_3,
                 (char **)
                 ") texture formats of a resolve operation must match exactly or be compatible typeless formats."
                 ,(char (*) [95])in_stack_fffffffffffffdb0);
      pCVar1 = (Char *)std::__cxx11::string::c_str();
      in_RCX = (char (*) [102])0x12f;
      DebugAssertionFailed
                (pCVar1,"VerifyResolveTextureSubresourceAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x12f);
      std::__cxx11::string::~string((string *)(msg_4.field_2._M_local_buf + 8));
    }
    if ((ResolveAttribs->Format != TEX_FORMAT_UNKNOWN) &&
       (in_RCX = (char (*) [102])(ulong)ResolveAttribs->Format,
       SrcTexDesc->Format != ResolveAttribs->Format)) {
      FormatString<char[50],char[39]>
                ((string *)((long)&msg_5.field_2 + 8),
                 (Diligent *)"Resolve texture subresource attribs are invalid: ",
                 (char (*) [50])"Invalid format of a resolve operation.",(char (*) [39])in_RCX);
      pCVar1 = (Char *)std::__cxx11::string::c_str();
      in_RCX = (char (*) [102])0x130;
      DebugAssertionFailed
                (pCVar1,"VerifyResolveTextureSubresourceAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x130);
      std::__cxx11::string::~string((string *)(msg_5.field_2._M_local_buf + 8));
    }
  }
  if ((((Args_1->IsTypeless & 1U) != 0) && ((Args_3->IsTypeless & 1U) != 0)) &&
     (ResolveAttribs->Format == TEX_FORMAT_UNKNOWN)) {
    FormatString<char[50],char[102]>
              ((string *)((long)&msg_6.field_2 + 8),
               (Diligent *)"Resolve texture subresource attribs are invalid: ",
               (char (*) [50])
               "format of a resolve operation must not be unknown when both src and dst texture formats are typeless."
               ,in_RCX);
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    in_RCX = (char (*) [102])0x135;
    DebugAssertionFailed
              (pCVar1,"VerifyResolveTextureSubresourceAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x135);
    std::__cxx11::string::~string((string *)(msg_6.field_2._M_local_buf + 8));
  }
  if ((((Args_1->IsTypeless & 1U) != 0) || ((Args_3->IsTypeless & 1U) != 0)) &&
     ((pTVar2->IsTypeless & 1U) != 0)) {
    FormatString<char[50],char[96]>
              ((string *)local_190,(Diligent *)"Resolve texture subresource attribs are invalid: ",
               (char (*) [50])
               "format of a resolve operation must not be typeless when one of the texture formats is typeless."
               ,(char (*) [96])in_RCX);
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar1,"VerifyResolveTextureSubresourceAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x13a);
    std::__cxx11::string::~string((string *)local_190);
  }
  return true;
}

Assistant:

bool VerifyResolveTextureSubresourceAttribs(const ResolveTextureSubresourceAttribs& ResolveAttribs,
                                            const TextureDesc&                      SrcTexDesc,
                                            const TextureDesc&                      DstTexDesc)
{
#define CHECK_RESOLVE_TEX_SUBRES_ATTRIBS(Expr, ...) CHECK_PARAMETER(Expr, "Resolve texture subresource attribs are invalid: ", __VA_ARGS__)

    CHECK_RESOLVE_TEX_SUBRES_ATTRIBS(SrcTexDesc.SampleCount > 1, "source texture '", SrcTexDesc.Name, "' of a resolve operation is not multi-sampled.");
    CHECK_RESOLVE_TEX_SUBRES_ATTRIBS(DstTexDesc.SampleCount == 1, "destination texture '", DstTexDesc.Name, "' of a resolve operation is multi-sampled.");

    MipLevelProperties SrcMipLevelProps = GetMipLevelProperties(SrcTexDesc, ResolveAttribs.SrcMipLevel);
    MipLevelProperties DstMipLevelProps = GetMipLevelProperties(DstTexDesc, ResolveAttribs.DstMipLevel);
    CHECK_RESOLVE_TEX_SUBRES_ATTRIBS(SrcMipLevelProps.LogicalWidth == DstMipLevelProps.LogicalWidth && SrcMipLevelProps.LogicalHeight == DstMipLevelProps.LogicalHeight,
                                     "the size (", SrcMipLevelProps.LogicalWidth, "x", SrcMipLevelProps.LogicalHeight,
                                     ") of the source subresource of a resolve operation (texture '",
                                     SrcTexDesc.Name, "', mip ", ResolveAttribs.SrcMipLevel, ", slice ", ResolveAttribs.SrcSlice,
                                     ") does not match the size (", DstMipLevelProps.LogicalWidth, "x", DstMipLevelProps.LogicalHeight,
                                     ") of the destination subresource (texture '", DstTexDesc.Name, "', mip ", ResolveAttribs.DstMipLevel, ", slice ",
                                     ResolveAttribs.DstSlice, ").");

    const TextureFormatAttribs& SrcFmtAttribs     = GetTextureFormatAttribs(SrcTexDesc.Format);
    const TextureFormatAttribs& DstFmtAttribs     = GetTextureFormatAttribs(DstTexDesc.Format);
    const TextureFormatAttribs& ResolveFmtAttribs = GetTextureFormatAttribs(ResolveAttribs.Format);
    if (!SrcFmtAttribs.IsTypeless && !DstFmtAttribs.IsTypeless)
    {
        CHECK_RESOLVE_TEX_SUBRES_ATTRIBS(SrcTexDesc.Format == DstTexDesc.Format,
                                         "source (", SrcFmtAttribs.Name, ") and destination (", DstFmtAttribs.Name,
                                         ") texture formats of a resolve operation must match exactly or be compatible typeless formats.");
        CHECK_RESOLVE_TEX_SUBRES_ATTRIBS(ResolveAttribs.Format == TEX_FORMAT_UNKNOWN || SrcTexDesc.Format == ResolveAttribs.Format, "Invalid format of a resolve operation.");
    }
    if (SrcFmtAttribs.IsTypeless && DstFmtAttribs.IsTypeless)
    {
        CHECK_RESOLVE_TEX_SUBRES_ATTRIBS(ResolveAttribs.Format != TEX_FORMAT_UNKNOWN,
                                         "format of a resolve operation must not be unknown when both src and dst texture formats are typeless.");
    }
    if (SrcFmtAttribs.IsTypeless || DstFmtAttribs.IsTypeless)
    {
        CHECK_RESOLVE_TEX_SUBRES_ATTRIBS(!ResolveFmtAttribs.IsTypeless,
                                         "format of a resolve operation must not be typeless when one of the texture formats is typeless.");
    }
#undef CHECK_RESOLVE_TEX_SUBRES_ATTRIBS

    return true;
}